

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

void __thiscall despot::RegDemo::RegDemo(RegDemo *this,string *params_file)

{
  char *pcVar1;
  istream local_230 [8];
  ifstream fin;
  string *params_file_local;
  RegDemo *this_local;
  
  despot::DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  MDP::MDP(&this->super_MDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  *(undefined ***)this = &PTR__RegDemo_00126ac0;
  *(undefined ***)&this->super_MDP = &PTR__RegDemo_00126bd0;
  *(undefined ***)&this->super_StateIndexer = &PTR__RegDemo_00126c20;
  *(undefined ***)&this->super_StatePolicy = &PTR__RegDemo_00126c58;
  std::vector<double,_std::allocator<double>_>::vector(&this->trap_prob_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->obs_);
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::vector
            (&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  MemoryPool<despot::RegDemoState>::MemoryPool(&this->memory_pool_);
  std::vector<int,_std::allocator<int>_>::vector(&this->default_action_);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_230,pcVar1,_S_in);
  Init(this,local_230);
  std::ifstream::close();
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

RegDemo::RegDemo(string params_file) {
	ifstream fin(params_file.c_str(), ifstream::in);
	Init(fin);
	fin.close();
}